

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O1

void gola_close(LexState *ls,VarInfo *vg)

{
  uint target;
  FuncState *fs;
  BCInsLine *pBVar1;
  long lVar2;
  BCPos list;
  
  fs = ls->fs;
  target = vg->startpc;
  pBVar1 = fs->bcbase;
  *(uint8_t *)((long)&pBVar1[target].ins + 1) = vg->slot;
  if ((char)pBVar1[target].ins == 'X') {
    lVar2 = (ulong)*(ushort *)((long)&fs->bcbase[target].ins + 2) - 0x8000;
    if ((lVar2 != -1) && (list = target + (int)lVar2 + 1, list != 0xffffffff)) {
      jmp_patch(fs,list,target);
    }
    *(undefined1 *)&pBVar1[target].ins = 0x32;
    *(undefined2 *)((long)&pBVar1[target].ins + 2) = 0x7fff;
  }
  return;
}

Assistant:

static void gola_close(LexState *ls, VarInfo *vg)
{
  FuncState *fs = ls->fs;
  BCPos pc = vg->startpc;
  BCIns *ip = &fs->bcbase[pc].ins;
  lj_assertFS(gola_isgoto(vg), "expected goto");
  lj_assertFS(bc_op(*ip) == BC_JMP || bc_op(*ip) == BC_UCLO,
	      "bad bytecode op %d", bc_op(*ip));
  setbc_a(ip, vg->slot);
  if (bc_op(*ip) == BC_JMP) {
    BCPos next = jmp_next(fs, pc);
    if (next != NO_JMP) jmp_patch(fs, next, pc);  /* Jump to UCLO. */
    setbc_op(ip, BC_UCLO);  /* Turn into UCLO. */
    setbc_j(ip, NO_JMP);
  }
}